

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_instance.cpp
# Opt level: O1

void ActiveLoaderInstance::Remove(void)

{
  unique_ptr<LoaderInstance,_std::default_delete<LoaderInstance>_> uVar1;
  
  anon_unknown.dwarf_61790::GetSetCurrentLoaderInstance();
  uVar1 = anon_unknown.dwarf_61790::GetSetCurrentLoaderInstance::current_loader_instance;
  anon_unknown.dwarf_61790::GetSetCurrentLoaderInstance::current_loader_instance._M_t.
  super___uniq_ptr_impl<LoaderInstance,_std::default_delete<LoaderInstance>_>._M_t.
  super__Tuple_impl<0UL,_LoaderInstance_*,_std::default_delete<LoaderInstance>_>.
  super__Head_base<0UL,_LoaderInstance_*,_false>._M_head_impl =
       (__uniq_ptr_data<LoaderInstance,_std::default_delete<LoaderInstance>,_true,_true>)
       (__uniq_ptr_impl<LoaderInstance,_std::default_delete<LoaderInstance>_>)0x0;
  if ((__uniq_ptr_impl<LoaderInstance,_std::default_delete<LoaderInstance>_>)
      uVar1._M_t.super___uniq_ptr_impl<LoaderInstance,_std::default_delete<LoaderInstance>_>._M_t.
      super__Tuple_impl<0UL,_LoaderInstance_*,_std::default_delete<LoaderInstance>_>.
      super__Head_base<0UL,_LoaderInstance_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<LoaderInstance,_std::default_delete<LoaderInstance>_>)0x0) {
    (**(code **)(*(long *)uVar1._M_t.
                          super___uniq_ptr_impl<LoaderInstance,_std::default_delete<LoaderInstance>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_LoaderInstance_*,_std::default_delete<LoaderInstance>_>
                          .super__Head_base<0UL,_LoaderInstance_*,_false>._M_head_impl + 8))();
    return;
  }
  return;
}

Assistant:

void Remove() { GetSetCurrentLoaderInstance().reset(nullptr); }